

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetDiagnosticPropertyData
          (IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,
          IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData)

{
  LOGGER_LOG p_Var1;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE pIVar2;
  char *local_70;
  char *local_60;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_RESULT result;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData_local;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if ((((iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) ||
       (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0)) ||
      (diagnosticData->diagnosticCreationTimeUtc == (char *)0x0)) ||
     (diagnosticData->diagnosticId == (char *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      if (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
        local_60 = (char *)0x0;
        local_70 = (char *)0x0;
      }
      else {
        local_60 = diagnosticData->diagnosticId;
        local_70 = diagnosticData->diagnosticCreationTimeUtc;
      }
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetDiagnosticPropertyData",0x378,1,
                "Invalid argument (iotHubMessageHandle=%p, diagnosticData=%p, diagnosticData->diagnosticId=%p, diagnosticData->diagnosticCreationTimeUtc=%p)"
                ,iotHubMessageHandle,diagnosticData,local_60,local_70);
    }
    l._4_4_ = IOTHUB_MESSAGE_INVALID_ARG;
  }
  else {
    if (iotHubMessageHandle->diagnosticData != (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0)
    {
      DestroyDiagnosticPropertyData(iotHubMessageHandle->diagnosticData);
      iotHubMessageHandle->diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0;
    }
    pIVar2 = CloneDiagnosticPropertyData(diagnosticData);
    iotHubMessageHandle->diagnosticData = pIVar2;
    if (pIVar2 == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_SetDiagnosticPropertyData",0x385,1,
                  "Failed saving a copy of diagnosticData");
      }
      l._4_4_ = IOTHUB_MESSAGE_ERROR;
    }
    else {
      l._4_4_ = IOTHUB_MESSAGE_OK;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetDiagnosticPropertyData(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* diagnosticData)
{
    IOTHUB_MESSAGE_RESULT result;
    if (iotHubMessageHandle == NULL ||
        diagnosticData == NULL ||
        diagnosticData->diagnosticCreationTimeUtc == NULL ||
        diagnosticData->diagnosticId == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, diagnosticData=%p, diagnosticData->diagnosticId=%p, diagnosticData->diagnosticCreationTimeUtc=%p)",
            iotHubMessageHandle, diagnosticData,
            diagnosticData == NULL ? NULL : diagnosticData->diagnosticId,
            diagnosticData == NULL ? NULL : diagnosticData->diagnosticCreationTimeUtc);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        if (iotHubMessageHandle->diagnosticData != NULL)
        {
            DestroyDiagnosticPropertyData(iotHubMessageHandle->diagnosticData);
            iotHubMessageHandle->diagnosticData = NULL;
        }

        if ((iotHubMessageHandle->diagnosticData = CloneDiagnosticPropertyData(diagnosticData)) == NULL)
        {
            LogError("Failed saving a copy of diagnosticData");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}